

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O1

void nhr_request_work_th_func(void *user_object)

{
  int iVar1;
  undefined4 uVar2;
  
  nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x80));
  iVar1 = *(int *)((long)user_object + 0x30);
  nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x80));
  while (iVar1 < 9999) {
    nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x78));
    nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x80));
    uVar2 = *(undefined4 *)((long)user_object + 0x30);
    nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x80));
    switch(uVar2) {
    case 1:
      nhr_request_connect_to_host((nhr_request)user_object);
      break;
    case 2:
      nhr_request_send_raw_request((nhr_request)user_object);
      break;
    case 3:
      nhr_request_start_waiting_raw_response((nhr_request)user_object);
      break;
    case 4:
      nhr_request_wait_raw_response((nhr_request)user_object);
    }
    nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x78));
    nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x80));
    iVar1 = *(int *)((long)user_object + 0x30);
    nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x80));
    if (iVar1 == 6) {
      nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x80));
      *(undefined4 *)((long)user_object + 0x30) = 9999;
      nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x80));
      if (*(code **)((long)user_object + 0x70) != (code *)0x0) {
        (**(code **)((long)user_object + 0x70))
                  (user_object,*(undefined4 *)((long)user_object + 0x48));
      }
    }
    else if (iVar1 == 5) {
      nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x80));
      *(undefined4 *)((long)user_object + 0x30) = 9999;
      nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x80));
      if (*(code **)((long)user_object + 0x68) != (code *)0x0) {
        (**(code **)((long)user_object + 0x68))
                  (user_object,*(undefined8 *)((long)user_object + 0x88));
      }
    }
    nhr_thread_sleep(5);
    nhr_mutex_lock(*(nhr_mutex *)((long)user_object + 0x80));
    iVar1 = *(int *)((long)user_object + 0x30);
    nhr_mutex_unlock(*(nhr_mutex *)((long)user_object + 0x80));
  }
  *(undefined8 *)((long)user_object + 0x28) = 0;
  if (*(int *)((long)user_object + 4) != -1) {
    close(*(int *)((long)user_object + 4));
    *(undefined4 *)((long)user_object + 4) = 0xffffffff;
  }
  nhr_request_delete((nhr_request)user_object);
  return;
}

Assistant:

static void nhr_request_work_th_func(void * user_object) {
	nhr_request r = (nhr_request)user_object;

	while (nhr_request_get_command(r) < NHR_COMMAND_END) {
		nhr_mutex_lock(r->work_mutex);
		switch (nhr_request_get_command(r)) {
			case NHR_COMMAND_CONNECT_TO_HOST: nhr_request_connect_to_host(r); break;
			case NHR_COMMAND_SEND_RAW_REQUEST: nhr_request_send_raw_request(r); break;
			case NHR_COMMAND_START_WAITING_RAW_RESPONSE: nhr_request_start_waiting_raw_response(r); break;
			case NHR_COMMAND_WAIT_RAW_RESPONSE: nhr_request_wait_raw_response(r); break;
			default: break;
		}
		nhr_mutex_unlock(r->work_mutex);

		switch (nhr_request_get_command(r)) {
			case NHR_COMMAND_INFORM_RESPONSE:
				nhr_request_set_command(r,NHR_COMMAND_END);
				if (r->on_recvd_response) {
					r->on_recvd_response(r, r->response);
				}
				break;
			case NHR_COMMAND_INFORM_ERROR:
				nhr_request_set_command(r, NHR_COMMAND_END);
				if (r->on_error) {
					r->on_error(r, r->error_code);
				}
				break;
			default: break;
		}

		nhr_thread_sleep(NHR_WORK_THREAD_DELAY);
	}

	r->work_thread = NULL;
	nhr_request_close(r);
	nhr_request_delete(r);
}